

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O2

int debug_lock_lock(uint mode,void *lock_)

{
  int iVar1;
  undefined8 uVar2;
  debug_lock *lock;
  char *pcVar3;
  
  if ((*(byte *)((long)lock_ + 4) & 2) == 0) {
    if ((mode & 0xc) != 0) {
      pcVar3 = "(mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0";
      uVar2 = 0x101;
LAB_001fae27:
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,uVar2,pcVar3,"debug_lock_lock");
    }
  }
  else if ((mode & 0xc) == 0) {
    pcVar3 = "mode & (EVTHREAD_READ|EVTHREAD_WRITE)";
    uVar2 = 0xff;
    goto LAB_001fae27;
  }
  lock = (debug_lock *)lock_;
  if (original_lock_fns_.lock != (_func_int_uint_void_ptr *)0x0) {
    lock = *(debug_lock **)((long)lock_ + 0x18);
    iVar1 = (*original_lock_fns_.lock)(mode,lock);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  evthread_debug_lock_mark_locked((uint)lock_,lock);
  return 0;
}

Assistant:

static int
debug_lock_lock(unsigned mode, void *lock_)
{
	struct debug_lock *lock = lock_;
	int res = 0;
	if (lock->locktype & EVTHREAD_LOCKTYPE_READWRITE)
		EVUTIL_ASSERT(mode & (EVTHREAD_READ|EVTHREAD_WRITE));
	else
		EVUTIL_ASSERT((mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0);
	if (original_lock_fns_.lock)
		res = original_lock_fns_.lock(mode, lock->lock);
	if (!res) {
		evthread_debug_lock_mark_locked(mode, lock);
	}
	return res;
}